

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
::write_decimal<unsigned_int>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
           *this,uint value)

{
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> out;
  type_conflict2 tVar1;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *ptVar2;
  value_type *pvVar3;
  uint in_ESI;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it;
  int num_digits;
  bool is_negative;
  main_type abs_value;
  size_t in_stack_ffffffffffffff58;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  size_t local_58;
  size_t in_stack_ffffffffffffffb0;
  value_type_conflict in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffb9 [23];
  uint32_t local_10;
  
  tVar1 = internal::is_negative<unsigned_int>(in_ESI);
  local_10 = in_ESI;
  if (tVar1) {
    local_10 = -in_ESI;
  }
  internal::count_digits(local_10);
  ptVar2 = reserve(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (tVar1) {
    internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>::operator++
              (&in_stack_ffffffffffffff60->out_,(int)(in_stack_ffffffffffffff58 >> 0x20));
    pvVar3 = internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>::operator*
                       ((truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)
                        &stack0xffffffffffffffc0);
    *pvVar3 = '-';
  }
  out.super_truncating_iterator_base<char_*>.limit_._0_1_ = in_stack_ffffffffffffffb8;
  out.super_truncating_iterator_base<char_*>.out_ = (char *)in_stack_ffffffffffffffb0;
  out._9_23_ = in_stack_ffffffffffffffb9;
  internal::
  format_decimal<char,fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,unsigned_int>
            (out,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
  (ptVar2->super_truncating_iterator_base<char_*>).out_ =
       (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
  (ptVar2->super_truncating_iterator_base<char_*>).limit_ = local_58;
  (ptVar2->super_truncating_iterator_base<char_*>).count_ = in_stack_ffffffffffffffb0;
  ptVar2->blackhole_ = in_stack_ffffffffffffffb8;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }